

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicCode.cpp
# Opt level: O0

void __thiscall
RhombicCode::sweepFullVertex
          (RhombicCode *this,int vertexIndex,vstr *sweepEdges,string *sweepDirection,
          vstr *upEdgeDirections)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  ulong uVar1;
  __type _Var2;
  size_type sVar3;
  invalid_argument *piVar4;
  string *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  undefined4 in_ESI;
  string *psVar5;
  string *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  invalid_argument *e_11;
  vint vertices_11;
  invalid_argument *e_10;
  vint vertices_10;
  invalid_argument *e_9;
  vint vertices_9;
  invalid_argument *e_8;
  vint vertices_8;
  invalid_argument *e_7;
  vint vertices_7;
  invalid_argument *e_6;
  vint vertices_6;
  int delIndex_1;
  invalid_argument *e_5;
  vint vertices_5;
  invalid_argument *e_4;
  vint vertices_4;
  invalid_argument *e_3;
  vint vertices_3;
  int delIndex;
  invalid_argument *e_2;
  vint vertices_2;
  invalid_argument *e_1;
  vint vertices_1;
  invalid_argument *e;
  vint vertices;
  difference_type sweepDirectionIndex;
  value_type *edge2;
  value_type *edge1;
  value_type *edge0;
  engine<unsigned_int,_unsigned_long,_pcg_detail::xsh_rr_mixin<unsigned_int,_unsigned_long>,_true,_pcg_detail::specific_stream<unsigned_long>,_pcg_detail::default_multiplier<unsigned_long>_>
  *in_stack_fffffffffffff288;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff290;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff298;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff2a0;
  const_iterator in_stack_fffffffffffff2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2b0;
  allocator_type *in_stack_fffffffffffff2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff2c0;
  iterator in_stack_fffffffffffff2c8;
  size_type in_stack_fffffffffffff2d0;
  undefined1 *puVar6;
  string *local_ce8;
  string *local_c98;
  string *local_c48;
  vstr *in_stack_fffffffffffff408;
  undefined8 in_stack_fffffffffffff410;
  int iVar7;
  undefined4 in_stack_fffffffffffff418;
  undefined4 in_stack_fffffffffffff41c;
  string *local_ba8;
  string *local_b48;
  string *local_af8;
  string *local_aa8;
  string *local_a40;
  string *local_9f0;
  string *local_9a0;
  undefined1 local_971;
  string *local_970;
  string local_968 [32];
  string local_948 [32];
  string local_928 [32];
  string *local_908;
  undefined8 local_900;
  string *local_8b8;
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string *local_850;
  undefined8 local_848;
  string *local_800;
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string *local_798;
  undefined8 local_790;
  string *local_748;
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string *local_6e0;
  undefined8 local_6d8;
  undefined1 local_691;
  string *local_690;
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string *local_628;
  undefined8 local_620;
  string *local_5d8;
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string *local_570;
  undefined8 local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_520;
  result_type_conflict local_50c;
  string *local_4f8;
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string *local_490;
  undefined8 local_488;
  string *local_440;
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string *local_3d8;
  undefined8 local_3d0;
  string *local_388;
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string *local_320;
  undefined8 local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  result_type_conflict local_2bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  string *local_288;
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string *local_220;
  undefined8 local_218;
  string *local_1d0;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string *local_168;
  undefined8 local_160;
  string *local_110;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string *local_a8;
  undefined8 local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  ulong local_48;
  const_reference local_40;
  const_reference local_38;
  const_reference local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  string *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  undefined4 local_c;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_30 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](in_R8,0);
  local_38 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_28,1);
  local_40 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_28,2);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff288);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff288);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff288);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (in_stack_fffffffffffff2a8._M_current,in_stack_fffffffffffff2a0,
                        in_stack_fffffffffffff298._M_current);
  local_48 = std::
             distance<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_18);
  uVar1 = local_48;
  if (sVar3 == 4) {
    local_110 = local_108;
    std::__cxx11::string::string(local_110,local_20);
    local_110 = local_e8;
    std::__cxx11::string::string(local_110,(string *)local_30);
    local_110 = local_c8;
    std::__cxx11::string::string(local_110,(string *)local_30);
    local_a8 = local_108;
    local_a0 = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x144dbf);
    __l._M_len = in_stack_fffffffffffff2d0;
    __l._M_array = in_stack_fffffffffffff2c8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffff2c0,__l,in_stack_fffffffffffff2b8);
    Code::faceVertices((Code *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                       (int)((ulong)in_stack_fffffffffffff410 >> 0x20),in_stack_fffffffffffff408);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff2a0._M_current);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x144e26);
    local_9a0 = (string *)&local_a8;
    do {
      local_9a0 = local_9a0 + -0x20;
      std::__cxx11::string::~string(local_9a0);
    } while (local_9a0 != local_108);
    Code::localFlip((Code *)in_stack_fffffffffffff2a0._M_current,
                    (vint *)in_stack_fffffffffffff298._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2a0._M_current);
    local_1d0 = local_1c8;
    std::__cxx11::string::string(local_1d0,local_20);
    local_1d0 = local_1a8;
    std::__cxx11::string::string(local_1d0,(string *)local_38);
    local_1d0 = local_188;
    std::__cxx11::string::string(local_1d0,(string *)local_38);
    local_168 = local_1c8;
    local_160 = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x145090);
    __l_00._M_len = in_stack_fffffffffffff2d0;
    __l_00._M_array = in_stack_fffffffffffff2c8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffff2c0,__l_00,in_stack_fffffffffffff2b8);
    Code::faceVertices((Code *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                       (int)((ulong)in_stack_fffffffffffff410 >> 0x20),in_stack_fffffffffffff408);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff2a0._M_current);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1450f7);
    local_9f0 = (string *)&local_168;
    do {
      local_9f0 = local_9f0 + -0x20;
      std::__cxx11::string::~string(local_9f0);
      iVar7 = (int)((ulong)in_stack_fffffffffffff410 >> 0x20);
    } while (local_9f0 != local_1c8);
    Code::localFlip((Code *)in_stack_fffffffffffff2a0._M_current,
                    (vint *)in_stack_fffffffffffff298._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2a0._M_current);
    local_288 = local_280;
    std::__cxx11::string::string(local_288,local_20);
    local_288 = local_260;
    std::__cxx11::string::string(local_288,(string *)local_40);
    local_288 = local_240;
    std::__cxx11::string::string(local_288,(string *)local_40);
    local_220 = local_280;
    local_218 = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x145361);
    __l_01._M_len = in_stack_fffffffffffff2d0;
    __l_01._M_array = in_stack_fffffffffffff2c8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffff2c0,__l_01,in_stack_fffffffffffff2b8);
    Code::faceVertices((Code *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),iVar7,
                       in_stack_fffffffffffff408);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff2a0._M_current);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1453c8);
    local_a40 = (string *)&local_220;
    do {
      local_a40 = local_a40 + -0x20;
      std::__cxx11::string::~string(local_a40);
    } while (local_a40 != local_280);
    Code::localFlip((Code *)in_stack_fffffffffffff2a0._M_current,
                    (vint *)in_stack_fffffffffffff298._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2a0._M_current);
    return;
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_18);
  iVar7 = (int)((ulong)in_stack_fffffffffffff410 >> 0x20);
  if (uVar1 < sVar3) {
    local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff288);
    local_2a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator+(in_stack_fffffffffffff298._M_current,
                            (difference_type)in_stack_fffffffffffff290);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              (in_stack_fffffffffffff290,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff288);
    local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase(in_stack_fffffffffffff2a0._M_current,in_stack_fffffffffffff2a8);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_18);
    if (sVar3 == 2) {
      local_2bc = std::uniform_int_distribution<int>::operator()
                            ((uniform_int_distribution<int> *)in_stack_fffffffffffff290,
                             in_stack_fffffffffffff288);
      local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff288);
      local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator+(in_stack_fffffffffffff298._M_current,
                              (difference_type)in_stack_fffffffffffff290);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                (in_stack_fffffffffffff290,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff288);
      local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::erase(in_stack_fffffffffffff2a0._M_current,in_stack_fffffffffffff2a8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,0);
    _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
    if (_Var2) {
      local_388 = local_380;
      std::__cxx11::string::string(local_388,local_20);
      local_388 = local_360;
      std::__cxx11::string::string(local_388,(string *)local_30);
      local_388 = local_340;
      std::__cxx11::string::string(local_388,(string *)local_30);
      local_320 = local_380;
      local_318 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1457b6);
      __l_02._M_len = in_stack_fffffffffffff2d0;
      __l_02._M_array = in_stack_fffffffffffff2c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff2c0,__l_02,in_stack_fffffffffffff2b8);
      Code::faceVertices((Code *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),iVar7
                         ,in_stack_fffffffffffff408);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff2a0._M_current);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x14581d);
      local_aa8 = (string *)&local_320;
      do {
        local_aa8 = local_aa8 + -0x20;
        std::__cxx11::string::~string(local_aa8);
      } while (local_aa8 != local_380);
      Code::localFlip((Code *)in_stack_fffffffffffff2a0._M_current,
                      (vint *)in_stack_fffffffffffff298._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2a0._M_current);
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,0);
    _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
    if (_Var2) {
      local_440 = local_438;
      std::__cxx11::string::string(local_440,local_20);
      local_440 = local_418;
      std::__cxx11::string::string(local_440,(string *)local_40);
      local_440 = local_3f8;
      std::__cxx11::string::string(local_440,(string *)local_40);
      local_3d8 = local_438;
      local_3d0 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x145ab6);
      __l_03._M_len = in_stack_fffffffffffff2d0;
      __l_03._M_array = in_stack_fffffffffffff2c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff2c0,__l_03,in_stack_fffffffffffff2b8);
      Code::faceVertices((Code *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),iVar7
                         ,in_stack_fffffffffffff408);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff2a0._M_current);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x145b1d);
      local_af8 = (string *)&local_3d8;
      do {
        local_af8 = local_af8 + -0x20;
        std::__cxx11::string::~string(local_af8);
      } while (local_af8 != local_438);
      Code::localFlip((Code *)in_stack_fffffffffffff2a0._M_current,
                      (vint *)in_stack_fffffffffffff298._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2a0._M_current);
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,0);
    _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
    if (_Var2) {
      local_4f8 = local_4f0;
      std::__cxx11::string::string(local_4f8,local_20);
      local_4f8 = local_4d0;
      std::__cxx11::string::string(local_4f8,(string *)local_38);
      local_4f8 = local_4b0;
      std::__cxx11::string::string(local_4f8,(string *)local_38);
      local_490 = local_4f0;
      local_488 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x145db6);
      __l_04._M_len = in_stack_fffffffffffff2d0;
      __l_04._M_array = in_stack_fffffffffffff2c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff2c0,__l_04,in_stack_fffffffffffff2b8);
      Code::faceVertices((Code *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),iVar7
                         ,in_stack_fffffffffffff408);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff2a0._M_current);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x145e1d);
      local_b48 = (string *)&local_490;
      do {
        local_b48 = local_b48 + -0x20;
        std::__cxx11::string::~string(local_b48);
      } while (local_b48 != local_4f0);
      Code::localFlip((Code *)in_stack_fffffffffffff2a0._M_current,
                      (vint *)in_stack_fffffffffffff298._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2a0._M_current);
      return;
    }
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid up-edges.");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_18);
  if (sVar3 == 3) {
    local_50c = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)in_stack_fffffffffffff290,
                           in_stack_fffffffffffff288);
    local_528 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff288);
    local_520 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator+(in_stack_fffffffffffff298._M_current,
                            (difference_type)in_stack_fffffffffffff290);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              (in_stack_fffffffffffff290,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff288);
    local_530 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase(in_stack_fffffffffffff2a0._M_current,in_stack_fffffffffffff2a8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
  if (_Var2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,1);
    _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
    iVar7 = (int)((ulong)in_stack_fffffffffffff410 >> 0x20);
    if (_Var2) goto LAB_001461af;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
  if (_Var2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,1);
    _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
    iVar7 = (int)((ulong)in_stack_fffffffffffff410 >> 0x20);
    if (_Var2) {
LAB_001461af:
      local_5d8 = local_5d0;
      std::__cxx11::string::string(local_5d8,local_20);
      local_5d8 = local_5b0;
      std::__cxx11::string::string(local_5d8,(string *)local_30);
      local_5d8 = local_590;
      std::__cxx11::string::string(local_5d8,(string *)local_30);
      local_570 = local_5d0;
      local_568 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x14624b);
      __l_05._M_len = in_stack_fffffffffffff2d0;
      __l_05._M_array = in_stack_fffffffffffff2c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff2c0,__l_05,in_stack_fffffffffffff2b8);
      Code::faceVertices((Code *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),iVar7
                         ,in_stack_fffffffffffff408);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff2a0._M_current);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1462b2);
      local_ba8 = (string *)&local_570;
      do {
        local_ba8 = local_ba8 + -0x20;
        std::__cxx11::string::~string(local_ba8);
      } while (local_ba8 != local_5d0);
      Code::localFlip((Code *)in_stack_fffffffffffff2a0._M_current,
                      (vint *)in_stack_fffffffffffff298._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2a0._M_current);
      local_690 = local_688;
      std::__cxx11::string::string(local_690,local_20);
      local_690 = local_668;
      std::__cxx11::string::string(local_690,(string *)local_40);
      local_690 = local_648;
      std::__cxx11::string::string(local_690,(string *)local_40);
      local_628 = local_688;
      local_620 = 3;
      iVar7 = (int)((ulong)&local_691 >> 0x20);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x14651c);
      __l_06._M_len = in_stack_fffffffffffff2d0;
      __l_06._M_array = in_stack_fffffffffffff2c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff2c0,__l_06,in_stack_fffffffffffff2b8);
      Code::faceVertices((Code *)CONCAT44(local_c,in_stack_fffffffffffff418),iVar7,
                         in_stack_fffffffffffff408);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff2a0._M_current);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x146583);
      psVar5 = (string *)&local_628;
      do {
        psVar5 = psVar5 + -0x20;
        std::__cxx11::string::~string(psVar5);
      } while (psVar5 != local_688);
      Code::localFlip((Code *)in_stack_fffffffffffff2a0._M_current,
                      (vint *)in_stack_fffffffffffff298._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2a0._M_current);
      return;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
  if (_Var2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,1);
    _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
    if (_Var2) goto LAB_001467f8;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
  if (_Var2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,1);
    _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
    if (_Var2) {
LAB_001467f8:
      local_748 = local_740;
      std::__cxx11::string::string(local_748,local_20);
      local_748 = local_720;
      std::__cxx11::string::string(local_748,(string *)local_30);
      local_748 = local_700;
      std::__cxx11::string::string(local_748,(string *)local_30);
      local_6e0 = local_740;
      local_6d8 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x146894);
      __l_07._M_len = in_stack_fffffffffffff2d0;
      __l_07._M_array = in_stack_fffffffffffff2c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff2c0,__l_07,in_stack_fffffffffffff2b8);
      Code::faceVertices((Code *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                         (int)((ulong)in_stack_fffffffffffff410 >> 0x20),in_stack_fffffffffffff408);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff2a0._M_current);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1468fb);
      local_c48 = (string *)&local_6e0;
      do {
        local_c48 = local_c48 + -0x20;
        std::__cxx11::string::~string(local_c48);
        iVar7 = (int)((ulong)in_stack_fffffffffffff410 >> 0x20);
      } while (local_c48 != local_740);
      Code::localFlip((Code *)in_stack_fffffffffffff2a0._M_current,
                      (vint *)in_stack_fffffffffffff298._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2a0._M_current);
      local_800 = local_7f8;
      std::__cxx11::string::string(local_800,local_20);
      local_800 = local_7d8;
      std::__cxx11::string::string(local_800,(string *)local_38);
      local_800 = local_7b8;
      std::__cxx11::string::string(local_800,(string *)local_38);
      local_798 = local_7f8;
      local_790 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x146b65);
      __l_08._M_len = in_stack_fffffffffffff2d0;
      __l_08._M_array = in_stack_fffffffffffff2c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff2c0,__l_08,in_stack_fffffffffffff2b8);
      Code::faceVertices((Code *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),iVar7
                         ,in_stack_fffffffffffff408);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff2a0._M_current);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x146bcc);
      local_c98 = (string *)&local_798;
      do {
        local_c98 = local_c98 + -0x20;
        std::__cxx11::string::~string(local_c98);
      } while (local_c98 != local_7f8);
      Code::localFlip((Code *)in_stack_fffffffffffff2a0._M_current,
                      (vint *)in_stack_fffffffffffff298._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2a0._M_current);
      return;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
  if (_Var2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,1);
    _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
    if (_Var2) goto LAB_00146e41;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
  if (_Var2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,1);
    _Var2 = std::operator==(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8._M_current);
    if (_Var2) {
LAB_00146e41:
      local_8b8 = local_8b0;
      std::__cxx11::string::string(local_8b8,local_20);
      local_8b8 = local_890;
      std::__cxx11::string::string(local_8b8,(string *)local_38);
      local_8b8 = local_870;
      std::__cxx11::string::string(local_8b8,(string *)local_38);
      local_850 = local_8b0;
      local_848 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x146edd);
      __l_09._M_len = in_stack_fffffffffffff2d0;
      __l_09._M_array = in_stack_fffffffffffff2c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff2c0,__l_09,in_stack_fffffffffffff2b8);
      Code::faceVertices((Code *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                         (int)((ulong)in_stack_fffffffffffff410 >> 0x20),in_stack_fffffffffffff408);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff2a0._M_current);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x146f44);
      local_ce8 = (string *)&local_850;
      do {
        local_ce8 = local_ce8 + -0x20;
        std::__cxx11::string::~string(local_ce8);
        iVar7 = (int)((ulong)in_stack_fffffffffffff410 >> 0x20);
      } while (local_ce8 != local_8b0);
      Code::localFlip((Code *)in_stack_fffffffffffff2a0._M_current,
                      (vint *)in_stack_fffffffffffff298._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2a0._M_current);
      local_970 = local_968;
      std::__cxx11::string::string(local_970,local_20);
      local_970 = local_948;
      std::__cxx11::string::string(local_970,(string *)local_40);
      local_970 = local_928;
      std::__cxx11::string::string(local_970,(string *)local_40);
      local_908 = local_968;
      local_900 = 3;
      puVar6 = &local_971;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x147184);
      __l_10._M_len = (size_type)puVar6;
      __l_10._M_array = in_stack_fffffffffffff2c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff2c0,__l_10,in_stack_fffffffffffff2b8);
      Code::faceVertices((Code *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),iVar7
                         ,in_stack_fffffffffffff408);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff2a0._M_current);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1471e5);
      psVar5 = local_968;
      this_00 = (string *)&local_908;
      do {
        this_00 = this_00 + -0x20;
        std::__cxx11::string::~string(this_00);
      } while (this_00 != psVar5);
      Code::localFlip((Code *)in_stack_fffffffffffff2a0._M_current,
                      (vint *)in_stack_fffffffffffff298._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff2a0._M_current);
      return;
    }
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Invalid up-edges.");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void RhombicCode::sweepFullVertex(const int vertexIndex, vstr &sweepEdges, const std::string &sweepDirection, const vstr &upEdgeDirections)
{
    // std::cout << "Sweep of coordinate = " << lattice->indexToCoordinate(vertexIndex) << " ... ";
    auto &edge0 = upEdgeDirections[0];
    auto &edge1 = upEdgeDirections[1];
    auto &edge2 = upEdgeDirections[2];
    // cartesian4 coordinate = lattice->indexToCoordinate(vertexIndex);
    auto sweepDirectionIndex = std::distance(sweepEdges.begin(), std::find(sweepEdges.begin(), sweepEdges.end(), sweepDirection));
    if (sweepEdges.size() == 4)
    {
        try
        {
            vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
            localFlip(vertices);
        }
        catch (const std::invalid_argument &e)
        {
            // std::cerr << "WARNING: " << e.what() << std::endl;
        }
        try
        {
            vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
            localFlip(vertices);
        }
        catch (const std::invalid_argument &e)
        {
            // std::cerr << "WARNING: " << e.what() << std::endl;
        }
        try
        {
            vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
            localFlip(vertices);
        }
        catch (const std::invalid_argument &e)
        {
            // std::cerr << "WARNING: " << e.what() << std::endl;
        }
    }
    else if (sweepDirectionIndex < sweepEdges.size())
    {
        sweepEdges.erase(sweepEdges.begin() + sweepDirectionIndex);
        if (sweepEdges.size() == 2)
        {
            // int delIndex = distInt0To1(mt);
            int delIndex = distInt0To1(rnEngine);
            sweepEdges.erase(sweepEdges.begin() + delIndex);
        }
        if (sweepEdges[0] == edge0)
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if (sweepEdges[0] == edge2)
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if (sweepEdges[0] == edge1)
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else
        {
            throw std::invalid_argument("Invalid up-edges.");
        }
    }
    else
    {
        if (sweepEdges.size() == 3)
        {
            // int delIndex = distInt0To2(mt);
            int delIndex = distInt0To2(rnEngine);
            sweepEdges.erase(sweepEdges.begin() + delIndex);
        }
        if ((sweepEdges[0] == edge0 && sweepEdges[1] == edge2) ||
            (sweepEdges[0] == edge2 && sweepEdges[1] == edge0))
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if ((sweepEdges[0] == edge0 && sweepEdges[1] == edge1) ||
                 (sweepEdges[0] == edge1 && sweepEdges[1] == edge0))
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if ((sweepEdges[0] == edge1 && sweepEdges[1] == edge2) ||
                 (sweepEdges[0] == edge2 && sweepEdges[1] == edge1))
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else
        {
            throw std::invalid_argument("Invalid up-edges.");
        }
    }
    // std::cout << "Successful." << std::endl;
}